

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_abs<int>(uint length)

{
  int *__p;
  ulong uVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 (*pauVar4) [16];
  ulong uVar5;
  int iVar6;
  int iVar7;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar8 [16];
  undefined1 (*local_28) [16];
  shared_ptr<int> pv;
  
  __p = sse::common::malloc<int>(length);
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void(*)(int*),void>
            ((__shared_ptr<int,(__gnu_cxx::_Lock_policy)2> *)&local_28,__p,sse::common::free<int>);
  lVar3 = 0;
  uVar1 = 0;
  pauVar4 = local_28;
  if (0 < (int)length) {
    uVar1 = (ulong)length;
  }
  for (; -lVar3 != uVar1; lVar3 = lVar3 + -1) {
    *(int *)*pauVar4 = (int)lVar3;
    pauVar4 = (undefined1 (*) [16])(*pauVar4 + 4);
  }
  pauVar4 = local_28;
  auVar8 = extraout_XMM0;
  for (iVar6 = (int)length >> 2; 3 < iVar6; iVar6 = iVar6 + -4) {
    auVar8 = pabsd(auVar8,*pauVar4);
    *pauVar4 = auVar8;
    auVar8 = pabsd(auVar8,pauVar4[1]);
    pauVar4[1] = auVar8;
    auVar8 = pabsd(auVar8,pauVar4[2]);
    pauVar4[2] = auVar8;
    auVar8 = pabsd(auVar8,pauVar4[3]);
    pauVar4[3] = auVar8;
    pauVar4 = pauVar4 + 4;
  }
  if (1 < iVar6) {
    auVar8 = pabsd(auVar8,*pauVar4);
    *pauVar4 = auVar8;
    auVar8 = pabsd(auVar8,pauVar4[1]);
    pauVar4[1] = auVar8;
    iVar6 = iVar6 + -2;
    pauVar4 = pauVar4 + 2;
  }
  if (iVar6 != 0) {
    auVar8 = pabsd(auVar8,*pauVar4);
    *pauVar4 = auVar8;
  }
  for (lVar3 = (long)(int)(length & 0xfffffffc); lVar3 < (int)length; lVar3 = lVar3 + 1) {
    iVar6 = *(int *)(*local_28 + lVar3 * 4);
    iVar7 = -iVar6;
    if (0 < iVar6) {
      iVar7 = iVar6;
    }
    *(int *)(*local_28 + lVar3 * 4) = iVar7;
  }
  uVar5 = 0;
  do {
    if (uVar1 == uVar5) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv);
      return;
    }
    lVar3 = uVar5 * 4;
    uVar5 = uVar5 + 1;
  } while (*(uint *)(*local_28 + lVar3) < 0x80000001);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_abs(unsigned int) [T = int]";
  *(undefined4 *)(puVar2 + 1) = 0x81;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}